

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

saint_t inverse_bw_transform(sauchar_t *T,sauchar_t *U,saidx_t *A,saidx_t n,saidx_t idx)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  saidx_t *__ptr;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  saint_t sVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  sauchar_t D [256];
  saidx_t C [256];
  byte abStack_538 [256];
  int local_438 [258];
  
  sVar8 = -1;
  if (((((idx <= n) && (T != (sauchar_t *)0x0)) && (U != (sauchar_t *)0x0)) &&
      ((-1 < (idx | n) && (n < 1 || idx != 0)))) && (sVar8 = 0, 1 < n)) {
    uVar9 = (ulong)(uint)n;
    __ptr = A;
    if ((A == (saidx_t *)0x0) && (__ptr = (saidx_t *)malloc(uVar9 * 4), __ptr == (saidx_t *)0x0)) {
      sVar8 = -2;
    }
    else {
      uVar13 = 0;
      memset(local_438,0,0x400);
      do {
        local_438[T[uVar13]] = local_438[T[uVar13]] + 1;
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
      lVar4 = 0;
      uVar3 = 0;
      iVar5 = 0;
      do {
        iVar2 = local_438[lVar4];
        if (0 < iVar2) {
          local_438[lVar4] = iVar5;
          lVar11 = (long)(int)uVar3;
          uVar3 = uVar3 + 1;
          abStack_538[lVar11] = (byte)lVar4;
          iVar5 = iVar5 + iVar2;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x100);
      if (idx < 1) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        do {
          iVar5 = local_438[T[uVar13]];
          local_438[T[uVar13]] = iVar5 + 1;
          __ptr[iVar5] = (saidx_t)uVar13;
          uVar13 = uVar13 + 1;
        } while ((uint)idx != uVar13);
        uVar13 = (ulong)(uint)idx;
      }
      if ((int)uVar13 < n) {
        do {
          pbVar1 = T + uVar13;
          uVar13 = uVar13 + 1;
          iVar5 = local_438[*pbVar1];
          local_438[*pbVar1] = iVar5 + 1;
          __ptr[iVar5] = (saidx_t)uVar13;
        } while (uVar9 != uVar13);
      }
      if (0 < (int)uVar3) {
        uVar13 = 0;
        do {
          local_438[uVar13] = local_438[abStack_538[uVar13]];
          uVar13 = uVar13 + 1;
        } while (uVar3 != uVar13);
      }
      uVar13 = 0;
      do {
        if ((int)uVar3 < 1) {
          lVar4 = 0;
        }
        else {
          iVar5 = 0;
          uVar7 = uVar3;
          do {
            uVar6 = uVar7 >> 1;
            iVar10 = uVar6 + iVar5;
            iVar2 = uVar6 + 1 + iVar5;
            if (idx <= local_438[iVar10]) {
              iVar2 = iVar5;
            }
            iVar5 = iVar2;
            uVar12 = (uint)(local_438[iVar10] < idx) & ~uVar7;
            uVar7 = uVar6 - uVar12;
          } while (uVar7 != 0 && uVar12 <= uVar6);
          lVar4 = (long)iVar5;
        }
        U[uVar13] = abStack_538[lVar4];
        idx = __ptr[(long)idx + -1];
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar9);
      sVar8 = 0;
      if (A == (saidx_t *)0x0) {
        free(__ptr);
      }
    }
  }
  return sVar8;
}

Assistant:

saint_t
inverse_bw_transform(const sauchar_t *T, sauchar_t *U, saidx_t *A,
                     saidx_t n, saidx_t idx) {
  saidx_t C[ALPHABET_SIZE];
  sauchar_t D[ALPHABET_SIZE];
  saidx_t *B;
  saidx_t i, p;
  saint_t c, d;

  /* Check arguments. */
  if((T == NULL) || (U == NULL) || (n < 0) || (idx < 0) ||
     (n < idx) || ((0 < n) && (idx == 0))) {
    return -1;
  }
  if(n <= 1) { return 0; }

  if((B = A) == NULL) {
    /* Allocate n*sizeof(saidx_t) bytes of memory. */
    if((B = (saidx_t *)malloc((size_t)n * sizeof(saidx_t))) == NULL) { return -2; }
  }

  /* Inverse BW transform. */
  for(c = 0; c < ALPHABET_SIZE; ++c) { C[c] = 0; }
  for(i = 0; i < n; ++i) { ++C[T[i]]; }
  for(c = 0, d = 0, i = 0; c < ALPHABET_SIZE; ++c) {
    p = C[c];
    if(0 < p) {
      C[c] = i;
      D[d++] = (sauchar_t)c;
      i += p;
    }
  }
  for(i = 0; i < idx; ++i) { B[C[T[i]]++] = i; }
  for( ; i < n; ++i)       { B[C[T[i]]++] = i + 1; }
  for(c = 0; c < d; ++c) { C[c] = C[D[c]]; }
  for(i = 0, p = idx; i < n; ++i) {
    U[i] = D[binarysearch_lower(C, d, p)];
    p = B[p - 1];
  }

  if(A == NULL) {
    /* Deallocate memory. */
    free(B);
  }

  return 0;
}